

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.h
# Opt level: O2

unique_ptr<spvtools::opt::analysis::VectorConstant,_std::default_delete<spvtools::opt::analysis::VectorConstant>_>
 __thiscall
spvtools::
MakeUnique<spvtools::opt::analysis::VectorConstant,spvtools::opt::analysis::Vector_const*&,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>&>
          (spvtools *this,Vector **args,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *args_1)

{
  VectorConstant *this_00;
  
  this_00 = (VectorConstant *)operator_new(0x30);
  opt::analysis::VectorConstant::VectorConstant(this_00,*args,args_1);
  *(VectorConstant **)this = this_00;
  return (__uniq_ptr_data<spvtools::opt::analysis::VectorConstant,_std::default_delete<spvtools::opt::analysis::VectorConstant>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::VectorConstant,_std::default_delete<spvtools::opt::analysis::VectorConstant>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}